

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord1.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord1::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RectangularVolumeRecord1 *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tCorner Location: ",0x12);
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1e0,&this->m_CornerLocation);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tRectangle Length: ",0x13);
  Vector::GetAsString_abi_cxx11_(&local_200,&this->m_RecLength);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tOrientation: ",0xe);
  EulerAngles::GetAsString_abi_cxx11_(&local_220,&this->m_Ori);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString RectangularVolumeRecord1::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tCorner Location: "  << m_CornerLocation.GetAsString()
       << "\tRectangle Length: " << m_RecLength.GetAsString()
       << "\tOrientation: "      << m_Ori.GetAsString();

    return ss.str();
}